

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall xmrig::Console::stop(Console *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    uv_tty_reset_mode();
    Handle::close<uv_tty_s*>((uv_tty_s *)0x1a5bcf);
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  return;
}

Assistant:

void xmrig::Console::stop()
{
    if (!m_tty) {
        return;
    }

    uv_tty_reset_mode();

    Handle::close(m_tty);
    m_tty = nullptr;
}